

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O0

void __thiscall Js::DelayedFreeArrayBuffer::ResetToNoMarkObject(DelayedFreeArrayBuffer *this)

{
  DelayedFreeArrayBuffer *this_local;
  
  SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount>::
  Map<Js::DelayedFreeArrayBuffer::ResetToNoMarkObject()::__0>
            ((SListBase<Js::ArrayBufferContentForDelayedFreeBase*,Memory::HeapAllocator,RealCount> *
             )this);
  return;
}

Assistant:

void Js::DelayedFreeArrayBuffer::ResetToNoMarkObject()
    {
        this->listOfBuffers.Map([](Js::ArrayBufferContentForDelayedFreeBase* item) {
            Assert(item != nullptr);
            item->SetMarkBit(false);
        });
    }